

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

void __thiscall crnlib::dxt_image::init_task(dxt_image *this,uint64 data,void *pData_ptr)

{
  int *piVar1;
  pack_params *p;
  crn_thread_id_t cVar2;
  long lVar3;
  bool bVar4;
  crn_thread_id_t cVar5;
  uchar *puVar6;
  uint y;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  color_quad_u8 pixels [16];
  set_block_pixels_context optimizer_context;
  uint local_fb4;
  ulong local_fa8;
  uint local_f90;
  color_quad_u8 local_f78 [18];
  set_block_pixels_context local_f30;
  
  piVar1 = *(int **)((long)pData_ptr + 8);
  p = *(pack_params **)((long)pData_ptr + 0x10);
  cVar5 = crn_get_current_thread_id();
  cVar2 = *(crn_thread_id_t *)((long)pData_ptr + 0x18);
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&local_f30.m_dxt1_optimizer);
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_f30.m_dxt5_optimizer);
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_p = (uint *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_p = (uint *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_p = (unsigned_short *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_luma.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors.m_size._0_1_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_selectors._9_7_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r
       = '\0';
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_coords._1_8_ = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_error = 0xffffffffffffffff;
  uVar16 = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_best_solution.m_valid = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_color4 = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_inten_table = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_error = 0xffffffffffffffff;
  local_f30.m_etc1_optimizer.m_optimizer.m_trial_solution.m_valid = false;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_p = (uchar *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_capacity = 0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pParams = (params *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pResult = (results *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pSorted_luma_indices = (uint32 *)0x0;
  local_f30.m_etc1_optimizer.m_optimizer.m_pSorted_luma = (uint32 *)0x0;
  if (this->m_blocks_y != 0) {
    local_fb4 = 0xffffffff;
    local_fa8 = 0;
    do {
      uVar8 = (ulong)this->m_blocks_x;
      bVar17 = this->m_blocks_x != 0;
      if ((bVar17) && (*(long *)((long)pData_ptr + 0x20) == 0)) {
        iVar15 = 0;
        uVar11 = 0;
        do {
          if (((~uVar16 & 0x3f) == 0 && cVar5 == cVar2) &&
              p->m_pProgress_callback != (progress_callback_func)0x0) {
            uVar7 = (int)uVar8 * this->m_blocks_y;
            uVar10 = ((uVar7 >> 1) + p->m_progress_range * uVar16) / uVar7 + p->m_progress_start;
            bVar4 = true;
            if (uVar10 != local_fb4) {
              bVar4 = (*p->m_pProgress_callback)(uVar10,p->m_pProgress_callback_user_data_ptr);
              local_fb4 = uVar10;
              if (bVar4) {
                bVar4 = true;
              }
              else {
                LOCK();
                *(undefined8 *)((long)pData_ptr + 0x20) = 1;
                UNLOCK();
                bVar4 = false;
              }
            }
            if (!bVar4) break;
          }
          if ((p->m_num_helper_threads == 0) ||
             (local_f90 = (uint)data, uVar16 % (p->m_num_helper_threads + 1) == local_f90)) {
            puVar6 = &local_f78[0].field_0.field_0.a;
            lVar9 = 0;
            do {
              uVar12 = (int)lVar9 + (uint)local_fa8 * 4;
              uVar7 = piVar1[1] - 1U;
              if (uVar12 < piVar1[1] - 1U) {
                uVar7 = uVar12;
              }
              lVar13 = 0;
              do {
                uVar14 = iVar15 + (int)lVar13;
                uVar12 = *piVar1 - 1U;
                if (uVar14 < *piVar1 - 1U) {
                  uVar12 = uVar14;
                }
                lVar3 = *(long *)(piVar1 + 6);
                uVar8 = (ulong)(piVar1[2] * uVar7 + uVar12);
                puVar6[lVar13 * 4 + -3] = *(uchar *)(lVar3 + uVar8 * 4);
                puVar6[lVar13 * 4 + -2] = *(uchar *)(lVar3 + 1 + uVar8 * 4);
                puVar6[lVar13 * 4 + -1] = *(uchar *)(lVar3 + 2 + uVar8 * 4);
                puVar6[lVar13 * 4] = *(uchar *)(lVar3 + 3 + uVar8 * 4);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 4);
              lVar9 = lVar9 + 1;
              puVar6 = puVar6 + 0x10;
            } while (lVar9 != 4);
            set_block_pixels(this,(uint)uVar11,(uint)local_fa8,local_f78,p,&local_f30);
          }
          uVar11 = uVar11 + 1;
          uVar16 = uVar16 + 1;
          uVar8 = (ulong)this->m_blocks_x;
          bVar17 = uVar11 < uVar8;
          if ((!bVar17) || (iVar15 = iVar15 + 4, *(long *)((long)pData_ptr + 0x20) != 0)) break;
        } while( true );
      }
    } while ((!bVar17) && (local_fa8 = local_fa8 + 1, local_fa8 < this->m_blocks_y));
  }
  etc1_optimizer::~etc1_optimizer(&local_f30.m_etc1_optimizer.m_optimizer);
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_f30.m_dxt5_optimizer);
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&local_f30.m_dxt1_optimizer);
  return;
}

Assistant:

void dxt_image::init_task(uint64 data, void* pData_ptr) {
  const uint thread_index = static_cast<uint>(data);
  init_task_params* pInit_params = static_cast<init_task_params*>(pData_ptr);

  const image_u8& img = *pInit_params->m_pImg;
  const pack_params& p = *pInit_params->m_pParams;
  const bool is_main_thread = (crn_get_current_thread_id() == pInit_params->m_main_thread);

  uint block_index = 0;

  set_block_pixels_context optimizer_context;
  int prev_progress_percentage = -1;

  for (uint block_y = 0; block_y < m_blocks_y; block_y++) {
    const uint pixel_ofs_y = block_y * cDXTBlockSize;

    for (uint block_x = 0; block_x < m_blocks_x; block_x++, block_index++) {
      if (pInit_params->m_canceled)
        return;

      if (p.m_pProgress_callback && is_main_thread && ((block_index & 63) == 63)) {
        const uint progress_percentage = p.m_progress_start + ((block_index * p.m_progress_range + get_total_blocks() / 2) / get_total_blocks());
        if ((int)progress_percentage != prev_progress_percentage) {
          prev_progress_percentage = progress_percentage;
          if (!(p.m_pProgress_callback)(progress_percentage, p.m_pProgress_callback_user_data_ptr)) {
            atomic_exchange32(&pInit_params->m_canceled, CRNLIB_TRUE);
            return;
          }
        }
      }

      if (p.m_num_helper_threads) {
        if ((block_index % (p.m_num_helper_threads + 1)) != thread_index)
          continue;
      }

      color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

      const uint pixel_ofs_x = block_x * cDXTBlockSize;

      for (uint y = 0; y < cDXTBlockSize; y++) {
        const uint iy = math::minimum(pixel_ofs_y + y, img.get_height() - 1);

        for (uint x = 0; x < cDXTBlockSize; x++) {
          const uint ix = math::minimum(pixel_ofs_x + x, img.get_width() - 1);

          pixels[x + y * cDXTBlockSize] = img(ix, iy);
        }
      }

      set_block_pixels(block_x, block_y, pixels, p, optimizer_context);
    }
  }
}